

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  long lVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  ulong uVar7;
  void *pvVar8;
  ReadOptions *options_00;
  Comparator *pCVar9;
  const_reference ppFVar10;
  Iterator *pIVar11;
  void *arg;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Iterator *result;
  size_t i;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int which;
  int num;
  Iterator **list;
  int space;
  ReadOptions options;
  Compaction *in_stack_ffffffffffffff48;
  InternalKeyComparator *in_stack_ffffffffffffff50;
  LevelFileNumIterator *in_stack_ffffffffffffff58;
  ReadOptions *in_stack_ffffffffffffff60;
  BlockFunction in_stack_ffffffffffffff70;
  Iterator *in_stack_ffffffffffffff78;
  Comparator *in_stack_ffffffffffffff80;
  int local_78;
  Table **in_stack_ffffffffffffffa0;
  uint64_t in_stack_ffffffffffffffa8;
  Comparator *file_number;
  int iVar12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ReadOptions::ReadOptions((ReadOptions *)in_stack_ffffffffffffff48);
  iVar4 = Compaction::level(in_stack_ffffffffffffff48);
  if (iVar4 == 0) {
    sVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       in_stack_ffffffffffffff48);
    local_78 = (int)sVar6 + 1;
  }
  else {
    local_78 = 2;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)local_78;
  uVar7 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  iVar4 = 0;
  for (iVar12 = 0; iVar12 < 2; iVar12 = iVar12 + 1) {
    bVar3 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       in_stack_ffffffffffffff58);
    iVar5 = iVar4;
    if (!bVar3) {
      iVar5 = Compaction::level(in_stack_ffffffffffffff48);
      if (iVar5 + iVar12 == 0) {
        options_00 = (ReadOptions *)(in_RSI + 0xc0 + (long)iVar12 * 0x18);
        in_stack_ffffffffffffff80 = (Comparator *)0x0;
        iVar5 = iVar4;
        while (file_number = in_stack_ffffffffffffff80,
              pCVar9 = (Comparator *)
                       std::
                       vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                       size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             *)in_stack_ffffffffffffff48), in_stack_ffffffffffffff80 < pCVar9) {
          in_stack_ffffffffffffff70 = *(BlockFunction *)(in_RDI + 0x30);
          ppFVar10 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                     ::operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   *)in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50)
          ;
          in_stack_ffffffffffffff78 = (Iterator *)(*ppFVar10)->number;
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     in_stack_ffffffffffffff58,(size_type)in_stack_ffffffffffffff50);
          pIVar11 = TableCache::NewIterator
                              ((TableCache *)CONCAT44(iVar5,iVar12),options_00,(uint64_t)file_number
                               ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
          *(Iterator **)((long)pvVar8 + (long)iVar5 * 8) = pIVar11;
          in_stack_ffffffffffffff80 = (Comparator *)((long)&file_number->_vptr_Comparator + 1);
          iVar5 = iVar5 + 1;
        }
      }
      else {
        arg = operator_new(0x58);
        Version::LevelFileNumIterator::LevelFileNumIterator
                  (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_ffffffffffffff48);
        pIVar11 = NewTwoLevelIterator(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,arg,
                                      in_stack_ffffffffffffff60);
        iVar5 = iVar4 + 1;
        *(Iterator **)((long)pvVar8 + (long)iVar4 * 8) = pIVar11;
      }
    }
    iVar4 = iVar5;
  }
  if (local_78 < iVar4) {
    __assert_fail("num <= space",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
  }
  pIVar11 = NewMergingIterator(in_stack_ffffffffffffff80,(Iterator **)in_stack_ffffffffffffff78,
                               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pIVar11;
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}